

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

bool __thiscall QResourceFileEngine::seek(QResourceFileEngine *this,qint64 pos)

{
  QAbstractFileEnginePrivate *pQVar1;
  QResourcePrivate *this_00;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 extraout_var;
  
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  this_00 = *(QResourcePrivate **)&pQVar1[1].fileError;
  QResourcePrivate::ensureInitialized(this_00);
  if (((this_00->related).d.size != 0) &&
     (pp_Var2 = pQVar1[1]._vptr_QAbstractFileEnginePrivate,
     iVar3 = (*(this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[6])(this),
     (long)pp_Var2 <= CONCAT44(extraout_var,iVar3))) {
    pQVar1[1]._vptr_QAbstractFileEnginePrivate = (_func_int **)pos;
    return true;
  }
  return false;
}

Assistant:

bool QResourceFileEngine::seek(qint64 pos)
{
    Q_D(QResourceFileEngine);
    if (!d->resource.isValid())
        return false;

    if (d->offset > size())
        return false;
    d->offset = pos;
    return true;
}